

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

Matrix44<float> * __thiscall
Imath_3_2::Matrix44<float>::shear<float>(Matrix44<float> *this,Vec3<float> *h)

{
  float fVar1;
  float fVar2;
  long lVar3;
  
  for (lVar3 = 8; lVar3 != 0xc; lVar3 = lVar3 + 1) {
    fVar1 = *(float *)((long)(this->x + -2) + lVar3 * 4);
    fVar2 = *(float *)((long)(this->x + -1) + lVar3 * 4);
    this->x[0][lVar3] = h->y * fVar1 + h->z * fVar2 + this->x[0][lVar3];
    *(float *)((long)(this->x + -1) + lVar3 * 4) = fVar1 * h->x + fVar2;
  }
  return this;
}

Assistant:

const Matrix44<T>&
                 Matrix44<T>::shear (const Vec3<S>& h) IMATH_NOEXCEPT
{
    //
    // In this case, we don't need a temp. copy of the matrix
    // because we never use a value on the RHS after we've
    // changed it on the LHS.
    //

    for (int i = 0; i < 4; i++)
    {
        x[2][i] += h.y * x[0][i] + h.z * x[1][i];
        x[1][i] += h.x * x[0][i];
    }

    return *this;
}